

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_>::operator=
          (ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *this,
          ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *param_1)

{
  ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *param_1_local;
  ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::Maybe<kj::Own<capnp::MessageReader>_>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;